

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O2

int mk_sched_init(mk_server *server)

{
  undefined8 *__ptr;
  void *__s;
  int line;
  int line_00;
  size_t size;
  
  __ptr = (undefined8 *)mk_mem_alloc_z(8);
  if (__ptr == (undefined8 *)0x0) {
    mk_utils_libc_error("malloc",(char *)0x1da,line);
  }
  else {
    size = (long)server->workers * 0xa0;
    __s = mk_mem_alloc(size);
    *__ptr = __s;
    if (__s != (void *)0x0) {
      memset(__s,0,size);
      pthread_mutex_init((pthread_mutex_t *)&server->pth_mutex,(pthread_mutexattr_t *)0x0);
      pthread_cond_init((pthread_cond_t *)&server->pth_cond,(pthread_condattr_t *)0x0);
      server->pth_init = 0;
      server->sched_ctx = __ptr;
      return 0;
    }
    mk_utils_libc_error("malloc",(char *)0x1e1,line_00);
    free(__ptr);
  }
  return -1;
}

Assistant:

int mk_sched_init(struct mk_server *server)
{
    int size;
    struct mk_sched_ctx *ctx;

    ctx = mk_mem_alloc_z(sizeof(struct mk_sched_ctx));
    if (!ctx) {
        mk_libc_error("malloc");
        return -1;
    }

    size = (sizeof(struct mk_sched_worker) * server->workers);
    ctx->workers = mk_mem_alloc(size);
    if (!ctx->workers) {
        mk_libc_error("malloc");
        mk_mem_free(ctx);
        return -1;
    }
    memset(ctx->workers, '\0', size);

    /* Initialize helpers */
    pthread_mutex_init(&server->pth_mutex, NULL);
    pthread_cond_init(&server->pth_cond, NULL);
    server->pth_init = MK_FALSE;

    /* Map context into server context */
    server->sched_ctx = ctx;

    /* The mk_thread_prepare call was replaced by mk_http_thread_initialize_tls
     * which is called earlier.
     */

    return 0;
}